

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O2

ZyanStatus
ZyanVectorInitCustomBuffer
          (ZyanVector *vector,ZyanUSize element_size,void *buffer,ZyanUSize capacity,
          ZyanMemberProcedure destructor)

{
  ZyanStatus ZVar1;
  
  ZVar1 = 0x80100004;
  if ((capacity != 0 && buffer != (void *)0x0) && (element_size != 0 && vector != (ZyanVector *)0x0)
     ) {
    vector->allocator = (ZyanAllocator *)0x0;
    vector->growth_factor = '\x01';
    vector->shrink_threshold = '\0';
    vector->size = 0;
    vector->capacity = capacity;
    vector->element_size = element_size;
    vector->destructor = destructor;
    vector->data = buffer;
    ZVar1 = 0x100000;
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZyanVectorInitCustomBuffer(ZyanVector* vector, ZyanUSize element_size,
    void* buffer, ZyanUSize capacity, ZyanMemberProcedure destructor)
{
    if (!vector || !element_size || !buffer || !capacity)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    vector->allocator        = ZYAN_NULL;
    vector->growth_factor    = 1;
    vector->shrink_threshold = 0;
    vector->size             = 0;
    vector->capacity         = capacity;
    vector->element_size     = element_size;
    vector->destructor       = destructor;
    vector->data             = buffer;

    return ZYAN_STATUS_SUCCESS;
}